

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::auxIsConnected(Graph *this,Vertex *v,int *n_markeds)

{
  Edge *pEVar1;
  
  if (v != (Vertex *)0x0) {
    if (v->marked == false) {
      v->marked = true;
      *n_markeds = *n_markeds + 1;
      for (pEVar1 = v->edgesList; pEVar1 != (Edge *)0x0; pEVar1 = pEVar1->nextEdge) {
        if (pEVar1->closed != false) {
          auxIsConnected(this,pEVar1->destiny,n_markeds);
        }
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n No NULL \n",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return;
}

Assistant:

void Graph::auxIsConnected(Vertex *v, int &n_markeds){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        if(v->getMarked() == false){
            v->setMarked(true);
            n_markeds++;

            for(Edge *a= v->getEdgesList(); a!=NULL; a= a->getNext()){

                //nao descer por arcos com chave aberta
                while(a!=NULL && a->isClosed() == false){
                    a = a->getNext();
                }

                if(a==NULL)
                    break;

                auxIsConnected(a->getDestiny(), n_markeds);
            }
        }
    }
}